

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
args::Command::GetCommandProgramLine_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Command *this,HelpParams *params)

{
  bool bVar1;
  char cVar2;
  Base **ppBVar3;
  const_iterator __position;
  pointer pcVar4;
  size_type sVar5;
  int iVar6;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  _Var7;
  long *plVar8;
  ulong *puVar9;
  size_type sVar10;
  string line;
  value_type local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  UpdateSubparserHelp(this,params);
  Group::GetProgramLine_abi_cxx11_(__return_storage_ptr__,&this->super_Group,params);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (this->subparserProgramLine).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->subparserProgramLine).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((params->proglineCommand)._M_string_length != 0) {
    ppBVar3 = (this->super_Group).children.
              super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<args::Base*const*,std::vector<args::Base*,std::allocator<args::Base*>>>,__gnu_cxx::__ops::_Iter_pred<args::Group::HasCommand()const::_lambda(args::Base*)_1_>>
                      ((this->super_Group).children.
                       super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                       super__Vector_impl_data._M_start,ppBVar3);
    if ((_Var7._M_current != ppBVar3) || (this->subparserHasCommand == true)) {
      bVar1 = this->commandIsRequired;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      if (bVar1 == true) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar4 = (params->proglineCommand)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar4,pcVar4 + (params->proglineCommand)._M_string_length);
      }
      else {
        std::operator+(&local_50,"[",&params->proglineCommand);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        puVar9 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_90.field_2._M_allocated_capacity = *puVar9;
          local_90.field_2._8_8_ = plVar8[3];
        }
        else {
          local_90.field_2._M_allocated_capacity = *puVar9;
          local_90._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_90._M_string_length = plVar8[1];
        *plVar8 = (long)puVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(__return_storage_ptr__,__position,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((bVar1 == false) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  if ((this->name)._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&this->name);
  }
  if (this->subparserHasFlag == false) {
    ppBVar3 = (this->super_Group).children.
              super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<args::Base*const*,std::vector<args::Base*,std::allocator<args::Base*>>>,__gnu_cxx::__ops::_Iter_pred<args::Group::HasFlag()const::_lambda(args::Base*)_1_>>
                      ((this->super_Group).children.
                       super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                       super__Vector_impl_data._M_start,ppBVar3);
    if (_Var7._M_current == ppBVar3) goto LAB_0014f9c5;
  }
  if ((params->showProglineOptions == true) && (params->proglineShowFlags == false)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&params->proglineOptions);
  }
LAB_0014f9c5:
  sVar5 = (this->proglinePostfix)._M_string_length;
  if (sVar5 != 0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    sVar10 = 0;
    local_90._M_string_length = 0;
    local_90.field_2._M_allocated_capacity =
         local_90.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar4 = (this->proglinePostfix)._M_dataplus._M_p;
    do {
      cVar2 = pcVar4[sVar10];
      iVar6 = isspace((int)cVar2);
      if (iVar6 == 0) {
        std::__cxx11::string::push_back((char)&local_90);
      }
      else {
        if (local_90._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_90);
          local_90._M_string_length = 0;
          *local_90._M_dataplus._M_p = '\0';
        }
        if (cVar2 == '\n') {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\n","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
      }
      sVar10 = sVar10 + 1;
    } while (sVar5 != sVar10);
    if (local_90._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetCommandProgramLine(const HelpParams &params) const
            {
                UpdateSubparserHelp(params);

                auto res = Group::GetProgramLine(params);
                res.insert(res.end(), subparserProgramLine.begin(), subparserProgramLine.end());

                if (!params.proglineCommand.empty() && (Group::HasCommand() || subparserHasCommand))
                {
                    res.insert(res.begin(), commandIsRequired ? params.proglineCommand : "[" + params.proglineCommand + "]");
                }

                if (!Name().empty())
                {
                    res.insert(res.begin(), Name());
                }

                if ((subparserHasFlag || Group::HasFlag()) && params.showProglineOptions && !params.proglineShowFlags)
                {
                    res.push_back(params.proglineOptions);
                }

                if (!ProglinePostfix().empty())
                {
                    std::string line;
                    for (char c : ProglinePostfix())
                    {
                        if (isspace(c))
                        {
                            if (!line.empty())
                            {
                                res.push_back(line);
                                line.clear();
                            }

                            if (c == '\n')
                            {
                                res.push_back("\n");
                            }
                        }
                        else
                        {
                            line += c;
                        }
                    }

                    if (!line.empty())
                    {
                        res.push_back(line);
                    }
                }

                return res;
            }